

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLimits.hpp
# Opt level: O2

void __thiscall
glcts::GeometryShaderMaxOutputComponentsTest::~GeometryShaderMaxOutputComponentsTest
          (GeometryShaderMaxOutputComponentsTest *this)

{
  (this->super_GeometryShaderLimitsRenderingBase).super_TestCaseBase.super_TestCase.super_TestNode.
  _vptr_TestNode = (_func_int **)&PTR__GeometryShaderMaxOutputComponentsTest_01df8308;
  std::__cxx11::string::~string((string *)&this->m_geometry_shader_code);
  std::__cxx11::string::~string((string *)&this->m_fragment_shader_code);
  TestCaseBase::~TestCaseBase((TestCaseBase *)this);
  return;
}

Assistant:

virtual ~GeometryShaderMaxOutputComponentsTest()
	{
	}